

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9745:35)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9745:35)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s2;
  _Alloc_hider __s1;
  size_type __n;
  int iVar1;
  InWhatOrder IVar2;
  long *plVar3;
  size_type *psVar4;
  size_t __len;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_98);
  __n = local_98._M_string_length;
  __s1._M_p = local_98._M_dataplus._M_p;
  __s2 = &local_58.field_2;
  local_58.field_2._M_allocated_capacity = 0x646572616c636564;
  local_58._M_string_length = 8;
  local_58.field_2._8_8_ = local_58.field_2._8_8_ & 0xffffffffffffff00;
  local_58._M_dataplus._M_p = (pointer)__s2;
  if (local_98._M_string_length < 9) {
    if ((local_98._M_string_length == 0) ||
       (iVar1 = bcmp(local_98._M_dataplus._M_p,__s2,local_98._M_string_length), iVar1 == 0)) {
      IVar2 = InDeclarationOrder;
    }
    else {
      local_58._M_string_length = 7;
      local_58.field_2._M_allocated_capacity = 0x6c61636978656c;
      local_58._M_dataplus._M_p = (pointer)__s2;
      if (__n == 8) goto LAB_0017c9ae;
      iVar1 = bcmp(__s1._M_p,__s2,__n);
      if (iVar1 == 0) {
        IVar2 = InLexicographicalOrder;
      }
      else {
        local_58._M_string_length = 6;
        local_58.field_2._M_allocated_capacity._0_7_ = 0x6d6f646e6172;
        local_58._M_dataplus._M_p = (pointer)__s2;
        if ((6 < __n) || (iVar1 = bcmp(__s1._M_p,__s2,__n), iVar1 != 0)) goto LAB_0017c9ae;
        IVar2 = InRandomOrder;
      }
    }
    ((this->m_lambda).config)->runOrder = IVar2;
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001cd738;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
LAB_0017c9ae:
    ::std::operator+(&local_78,"Unrecognised ordering: \'",&local_98);
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_78);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_58.field_2._M_allocated_capacity = *psVar4;
      local_58.field_2._8_8_ = plVar3[3];
      local_58._M_dataplus._M_p = (pointer)__s2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar4;
      local_58._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_58._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
              (__return_storage_ptr__,RuntimeError,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != __s2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }